

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

v128 fold_mul_and_sum(v128 partiala,v128 partialb,v128 const1,v128 const2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM3_Qb;
  v128 alVar7;
  v128 tmp;
  v128 const2_local;
  v128 const1_local;
  v128 partialb_local;
  v128 partiala_local;
  
  auVar1 = vpinsrd_avx(ZEXT416(0xb0a0d0c),0x7060908,1);
  auVar1 = vpinsrd_avx(auVar1,0x3020504,2);
  auVar1 = vpinsrd_avx(auVar1,0xf0e0100,3);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar1 = vpshufb_avx(auVar2,auVar1);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar3 = vpunpcklwd_avx(auVar3,auVar1);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar2 = vpunpckhwd_avx(auVar4,auVar1);
  auVar1 = vpmaddwd_avx(auVar3,auVar3);
  auVar2 = vpmaddwd_avx(auVar2,auVar2);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  auVar1 = vpmulld_avx(auVar1,auVar5);
  auVar6._8_8_ = in_XMM3_Qb;
  auVar6._0_8_ = in_XMM3_Qa;
  auVar2 = vpmulld_avx(auVar2,auVar6);
  vpaddd_avx(auVar1,auVar2);
  alVar7[1]._0_4_ = 0x7060908;
  alVar7[0] = 0xf0e0100;
  alVar7[1]._4_4_ = 0;
  return alVar7;
}

Assistant:

static inline v128 fold_mul_and_sum(v128 partiala, v128 partialb, v128 const1,
                                    v128 const2) {
  v128 tmp;
  /* Reverse partial B. */
  partialb = v128_shuffle_8(
      partialb, v128_from_32(0x0f0e0100, 0x03020504, 0x07060908, 0x0b0a0d0c));
  /* Interleave the x and y values of identical indices and pair x8 with 0. */
  tmp = partiala;
  partiala = v128_ziplo_16(partialb, partiala);
  partialb = v128_ziphi_16(partialb, tmp);
  /* Square and add the corresponding x and y values. */
  partiala = v128_madd_s16(partiala, partiala);
  partialb = v128_madd_s16(partialb, partialb);
  /* Multiply by constant. */
  partiala = v128_mullo_s32(partiala, const1);
  partialb = v128_mullo_s32(partialb, const2);
  /* Sum all results. */
  partiala = v128_add_32(partiala, partialb);
  return partiala;
}